

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

DPIImportSyntax * __thiscall
slang::parsing::Parser::parseDPIImport(Parser *this,AttrList attributes)

{
  SourceRange range;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  SourceRange range_00;
  Token keyword_00;
  Token property_00;
  Token c_identifier_00;
  Token equals_00;
  bool bVar1;
  FunctionPrototypeSyntax *this_00;
  DPIImportSyntax *pDVar2;
  Parser *in_RDI;
  Token semi_00;
  Token TVar3;
  Token semi;
  FunctionPrototypeSyntax *method;
  bool *in_stack_00000148;
  SyntaxKind in_stack_00000154;
  Parser *in_stack_00000158;
  bitmask<slang::parsing::detail::FunctionOptions> in_stack_00000164;
  Token equals;
  Token c_identifier;
  Token property;
  Token specString;
  Token keyword;
  undefined8 in_stack_fffffffffffffe08;
  FunctionOptions r;
  Diagnostic *in_stack_fffffffffffffe10;
  undefined6 in_stack_fffffffffffffe18;
  TokenKind in_stack_fffffffffffffe1e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe20;
  ParserBase *in_stack_fffffffffffffe28;
  SourceLocation in_stack_fffffffffffffe30;
  SourceLocation in_stack_fffffffffffffe38;
  DiagCode in_stack_fffffffffffffe44;
  SyntaxFactory *pSVar4;
  Diagnostic *in_stack_fffffffffffffe58;
  TokenKind in_stack_fffffffffffffe9e;
  ParserBase *in_stack_fffffffffffffea0;
  Info *local_e8;
  Info *local_b0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_a8;
  Info *local_a0;
  Info *local_98;
  Info *local_90;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_88;
  Info *local_80;
  Info *local_78;
  undefined8 local_70;
  FunctionPrototypeSyntax *local_68;
  undefined8 local_60;
  FunctionPrototypeSyntax *local_58;
  
  r = (FunctionOptions)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  ParserBase::consume((ParserBase *)in_stack_fffffffffffffe30);
  semi_00 = parseDPISpecString(in_RDI);
  Token::Token((Token *)in_stack_fffffffffffffe10);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe20._M_extent_value,
                           in_stack_fffffffffffffe1e);
  if ((bVar1) ||
     (bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe20._M_extent_value,
                               in_stack_fffffffffffffe1e), bVar1)) {
    TVar3 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffe30);
    local_70 = TVar3._0_8_;
    local_60 = local_70;
    local_68 = (FunctionPrototypeSyntax *)TVar3.info;
    local_58 = local_68;
  }
  Token::Token((Token *)in_stack_fffffffffffffe10);
  Token::Token((Token *)in_stack_fffffffffffffe10);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe20._M_extent_value,
                           in_stack_fffffffffffffe1e);
  if (bVar1) {
    TVar3 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffe30);
    local_a0 = TVar3._0_8_;
    local_80 = local_a0;
    local_98 = TVar3.info;
    local_78 = local_98;
    TVar3 = ParserBase::expect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9e);
    local_b0 = TVar3._0_8_;
    local_90 = local_b0;
    local_a8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar3.info;
    local_88 = local_a8;
  }
  detail::operator|((FunctionOptions)in_stack_fffffffffffffe10,r);
  this_00 = parseFunctionPrototype
                      (in_stack_00000158,in_stack_00000154,in_stack_00000164,in_stack_00000148);
  if (((short)local_60 == 0xf8) && ((this_00->keyword).kind == TaskKeyword)) {
    Token::range((Token *)in_stack_fffffffffffffe30);
    range_00.endLoc = in_stack_fffffffffffffe38;
    range_00.startLoc = in_stack_fffffffffffffe30;
    in_stack_fffffffffffffe58 =
         ParserBase::addDiag(in_stack_fffffffffffffe28,in_stack_fffffffffffffe44,range_00);
    Token::range((Token *)in_stack_fffffffffffffe30);
    range.startLoc._6_2_ = in_stack_fffffffffffffe1e;
    range.startLoc._0_6_ = in_stack_fffffffffffffe18;
    range.endLoc = (SourceLocation)in_stack_fffffffffffffe20._M_extent_value;
    Diagnostic::operator<<(in_stack_fffffffffffffe10,range);
  }
  TVar3 = ParserBase::expect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9e);
  pSVar4 = &in_RDI->factory;
  elements._M_ptr._6_2_ = in_stack_fffffffffffffe1e;
  elements._M_ptr._0_6_ = in_stack_fffffffffffffe18;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffe20._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffe10,
             elements);
  local_e8 = TVar3.info;
  keyword_00.info = (Info *)in_stack_fffffffffffffe58;
  keyword_00._0_8_ = pSVar4;
  property_00.info = local_90;
  property_00._0_8_ = local_e8;
  c_identifier_00.info = local_80;
  c_identifier_00._0_8_ = local_88;
  equals_00.info._0_6_ = (int6)local_60;
  equals_00._0_8_ = local_78;
  equals_00.info._6_2_ = (short)((ulong)local_60 >> 0x30);
  pDVar2 = slang::syntax::SyntaxFactory::dPIImport
                     ((SyntaxFactory *)this_00,local_88,keyword_00,TVar3,property_00,c_identifier_00
                      ,equals_00,local_58,semi_00);
  return pDVar2;
}

Assistant:

DPIImportSyntax& Parser::parseDPIImport(AttrList attributes) {
    Token keyword = consume();
    Token specString = parseDPISpecString();

    Token property;
    if (peek(TokenKind::ContextKeyword) || peek(TokenKind::PureKeyword))
        property = consume();

    Token c_identifier, equals;
    if (peek(TokenKind::Identifier)) {
        c_identifier = consume();
        equals = expect(TokenKind::Equals);
    }

    auto& method = parseFunctionPrototype(
        SyntaxKind::Unknown, FunctionOptions::AllowImplicitReturn | FunctionOptions::IsPrototype);

    if (property.kind == TokenKind::PureKeyword && method.keyword.kind == TokenKind::TaskKeyword)
        addDiag(diag::DPIPureTask, method.keyword.range()) << property.range();

    Token semi = expect(TokenKind::Semicolon);
    return factory.dPIImport(attributes, keyword, specString, property, c_identifier, equals,
                             method, semi);
}